

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

int Dau_DsdNormalizeCompare(char *pStr,int *pMarks,int i,int j)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  
  pbVar5 = (byte *)(pStr + pMarks[i]);
  pbVar7 = (byte *)(pStr + pMarks[(long)i + 1]);
  pbVar6 = (byte *)(pStr + pMarks[(long)j + 1]);
  for (pbVar4 = (byte *)(pStr + pMarks[j]); (pbVar5 < pbVar7 && (pbVar4 < pbVar6));
      pbVar4 = pbVar4 + 1) {
    bVar1 = *pbVar5;
    if ((byte)(bVar1 + 0x9f) < 0x1a) {
      bVar2 = *pbVar4;
      if ((byte)(bVar2 + 0x9f) < 0x1a) {
        if (bVar1 < bVar2) {
          return -1;
        }
        if (bVar2 < bVar1) {
          return 1;
        }
      }
      else {
        pbVar5 = pbVar5 + -1;
      }
    }
    else {
      pbVar4 = pbVar4 + -1;
    }
    pbVar5 = pbVar5 + 1;
  }
  if ((pbVar7 <= pbVar5) && (pbVar6 <= pbVar4)) {
    __assert_fail("pStr1 < pLimit1 || pStr2 < pLimit2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                  ,0xb5,"int Dau_DsdNormalizeCompare(char *, int *, int, int)");
  }
  iVar3 = -1;
  if ((pbVar5 != pbVar7) && (iVar3 = 1, pbVar4 != pbVar6)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                  ,0xba,"int Dau_DsdNormalizeCompare(char *, int *, int, int)");
  }
  return iVar3;
}

Assistant:

int Dau_DsdNormalizeCompare( char * pStr, int * pMarks, int i, int j )
{
    char * pStr1 = pStr + pMarks[i];
    char * pStr2 = pStr + pMarks[j];
    char * pLimit1 = pStr + pMarks[i+1];
    char * pLimit2 = pStr + pMarks[j+1];
    for ( ; pStr1 < pLimit1 && pStr2 < pLimit2; pStr1++, pStr2++ )
    {
        if ( !(*pStr1 >= 'a' &&  *pStr1 <= 'z') )
        {
            pStr2--;
            continue;
        }
        if ( !(*pStr2 >= 'a' &&  *pStr2 <= 'z') )
        {
            pStr1--;
            continue;
        }
        if ( *pStr1 < *pStr2 )
            return -1;
        if ( *pStr1 > *pStr2 )
            return 1;
    }
    assert( pStr1 < pLimit1 || pStr2 < pLimit2 );
    if ( pStr1 == pLimit1 )
        return -1;
    if ( pStr2 == pLimit2 )
        return 1;
    assert( 0 );
    return 0;
}